

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_verify.cpp
# Opt level: O0

void __thiscall embree::Scene::checkIfModifiedAndSet(Scene *this)

{
  bool bVar1;
  task_group_context *in_RDI;
  anon_class_8_1_8991fb9c_for_pred geometryIsModified;
  task_group_context context;
  atomic_bool ret;
  task_group_context *body;
  task_group_context *this_00;
  blocked_range<unsigned_long> local_d0 [6];
  unsigned_long local_30;
  unsigned_long local_28;
  char *local_18;
  
  if ((in_RDI[4].padding[8] & 1U) == 0) {
    local_18 = in_RDI[3].padding + 8;
    local_30 = *(unsigned_long *)(in_RDI[3].padding + 0x10);
    local_28 = 0;
    body = in_RDI;
    this_00 = in_RDI;
    std::atomic<bool>::operator=((atomic<bool> *)in_RDI,false);
    tbb::detail::d1::task_group_context::task_group_context
              (this_00,(kind_type)((ulong)body >> 0x20),(uintptr_t)in_RDI);
    tbb::detail::d1::blocked_range<unsigned_long>::blocked_range(local_d0,local_28,local_30,1);
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_any_of<unsigned_long,embree::Scene::checkIfModifiedAndSet()::__0>(unsigned_long,unsigned_long,embree::Scene::checkIfModifiedAndSet()::__0)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
              ((blocked_range<unsigned_long> *)this_00,(anon_class_24_3_a896bc58 *)body);
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)body);
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)0x2440c8);
    if (bVar1) {
      in_RDI[4].padding[8] = '\x01';
    }
  }
  return;
}

Assistant:

void Scene::checkIfModifiedAndSet ()
{
  if (isModified ()) return;

  auto geometryIsModified = [this](size_t geomID)->bool {
    return isGeometryModified(geomID);
  };

  if (parallel_any_of (size_t(0), geometries.size (), geometryIsModified)) {
    setModified ();
  }
}